

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateAccel.cpp
# Opt level: O2

bool __thiscall CalibrateAccel::CalculateMean(CalibrateAccel *this,Vector3d *Mean)

{
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  double dVar1;
  pointer pMVar2;
  pointer pMVar3;
  double dVar4;
  long lVar5;
  pointer pMVar6;
  long lVar7;
  undefined1 auVar8 [16];
  double local_40 [2];
  
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    this_00 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(Mean + lVar7);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)local_40);
    pMVar3 = this->Accel[lVar7].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar2 = this->Accel[lVar7].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pMVar6 = pMVar2; pMVar6 != pMVar3; pMVar6 = pMVar6 + 1) {
      dVar1 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      dVar4 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      *(double *)this_00 =
           *(double *)this_00 +
           (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
      *(double *)(this_00 + 8) = *(double *)(this_00 + 8) + dVar4;
      *(double *)(this_00 + 0x10) = dVar1 + *(double *)(this_00 + 0x10);
    }
    lVar5 = ((long)pMVar3 - (long)pMVar2) / 0x18;
    auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = 0x45300000;
    local_40[0] = (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=(this_00,(Scalar *)local_40);
  }
  return true;
}

Assistant:

bool CalibrateAccel::CalculateMean(Vector3d* Mean)
{
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            Mean[i] = Vector3d::Zero();
            for(auto data : this->Accel[i])
            {
                Mean[i][0] += data[0];
                Mean[i][1] += data[1];
                Mean[i][2] += data[2];
            }
            Mean[i] /= Accel[i].size();
        }
        catch(const std::exception& e)
        {
            std::cerr << e.what() << '\n';
            return false;
        }
    }

    return true;
}